

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::EffectiveSideOrder
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,int side)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined4 uVar2;
  undefined8 extraout_RDX;
  
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x248))();
  if (iVar1 != 0) {
    uVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x250))(this,0,side);
    UNRECOVERED_JUMPTABLE =
         *(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                              super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                              super_TPZCompEl + 0x3c0);
    iVar1 = (*UNRECOVERED_JUMPTABLE)(this,uVar2,extraout_RDX,UNRECOVERED_JUMPTABLE);
    return iVar1;
  }
  return -1;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::EffectiveSideOrder(int side) const
{
	if(!NSideConnects(side)) return -1;
	int cindex =SideConnectLocId(0, side);
#ifdef PZDEBUG
    if(cindex<0 || cindex >= NConnects()) DebugStop();
#endif
    return ConnectOrder(cindex);

}